

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::Dynamic_Object_Constructor
          (Dynamic_Object_Constructor *this,string *t_type_name,Proxy_Function *t_func)

{
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> _Stack_38;
  
  build_type_list((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                  &_Stack_38,
                  &((t_func->
                    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->m_types);
  Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&_Stack_38,
             ((t_func->
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->m_arity + -1);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&_Stack_38);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Object_Constructor_0047f3b8;
  std::__cxx11::string::string(&this->m_type_name,t_type_name);
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->m_func).
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ,&t_func->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              );
  if (((t_func->
       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->m_arity != 0) {
    return;
  }
  __assert_fail("(t_func->get_arity() > 0 || t_func->get_arity() < 0) && \"Programming error, Dynamic_Object_Function must have at least one parameter (this)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/../dispatchkit/dynamic_object_detail.hpp"
                ,0x9f,
                "chaiscript::dispatch::detail::Dynamic_Object_Constructor::Dynamic_Object_Constructor(std::string, const Proxy_Function &)"
               );
}

Assistant:

Dynamic_Object_Constructor(std::string t_type_name, const Proxy_Function &t_func)
            : Proxy_Function_Base(build_type_list(t_func->get_param_types()), t_func->get_arity() - 1)
            , m_type_name(std::move(t_type_name))
            , m_func(t_func) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }